

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraigTable.c
# Opt level: O0

Fraig_Node_t * Fraig_HashTableLookupF(Fraig_Man_t *pMan,Fraig_Node_t *pNode)

{
  Fraig_HashTable_t *p_00;
  int iVar1;
  uint local_3c;
  Fraig_Node_t *pFStack_38;
  uint Key;
  Fraig_Node_t *pEntD;
  Fraig_Node_t *pEnt;
  Fraig_HashTable_t *p;
  Fraig_Node_t *pNode_local;
  Fraig_Man_t *pMan_local;
  
  p_00 = pMan->pTableF;
  local_3c = pNode->uHashR % (uint)p_00->nBins;
  pEntD = p_00->pBins[local_3c];
  while( true ) {
    if (pEntD == (Fraig_Node_t *)0x0) {
      if (SBORROW4(p_00->nEntries,p_00->nBins * 2) == p_00->nEntries + p_00->nBins * -2 < 0) {
        Fraig_TableResizeF(p_00,1);
        local_3c = pNode->uHashR % (uint)p_00->nBins;
      }
      pNode->pNextF = p_00->pBins[local_3c];
      p_00->pBins[local_3c] = pNode;
      p_00->nEntries = p_00->nEntries + 1;
      return (Fraig_Node_t *)0x0;
    }
    iVar1 = Fraig_CompareSimInfo(pNode,pEntD,pMan->nWordsRand,1);
    if (iVar1 != 0) break;
    pEntD = pEntD->pNextF;
  }
  pFStack_38 = pEntD;
  while( true ) {
    if (pFStack_38 == (Fraig_Node_t *)0x0) {
      pNode->pNextD = pEntD->pNextD;
      pEntD->pNextD = pNode;
      return (Fraig_Node_t *)0x0;
    }
    iVar1 = Fraig_CompareSimInfo(pNode,pFStack_38,pMan->iWordStart,0);
    if (iVar1 != 0) break;
    pFStack_38 = pFStack_38->pNextD;
  }
  return pFStack_38;
}

Assistant:

Fraig_Node_t * Fraig_HashTableLookupF( Fraig_Man_t * pMan, Fraig_Node_t * pNode )
{
    Fraig_HashTable_t * p = pMan->pTableF;
    Fraig_Node_t * pEnt, * pEntD;
    unsigned Key;

    // go through the hash table entries
    Key = pNode->uHashR % p->nBins;
    Fraig_TableBinForEachEntryF( p->pBins[Key], pEnt )
    {
        // if their simulation info differs, skip
        if ( !Fraig_CompareSimInfo( pNode, pEnt, pMan->nWordsRand, 1 ) )
            continue;
        // equivalent up to the complement
        Fraig_TableBinForEachEntryD( pEnt, pEntD )
        {
            // if their simulation info differs, skip
            if ( !Fraig_CompareSimInfo( pNode, pEntD, pMan->iWordStart, 0 ) )
                continue;
            // found a simulation-equivalent node
            return pEntD; 
        }
        // did not find a simulation equivalent node
        // add the node to the corresponding linked list
        pNode->pNextD = pEnt->pNextD;
        pEnt->pNextD  = pNode;
        // return NULL, because there is no functional equivalence in this case
        return NULL;
    }

    // check if it is a good time for table resizing
    if ( p->nEntries >= 2 * p->nBins )
    {
        Fraig_TableResizeF( p, 1 );
        Key = pNode->uHashR % p->nBins;
    }

    // add the node to the corresponding linked list in the table
    pNode->pNextF = p->pBins[Key];
    p->pBins[Key] = pNode;
    p->nEntries++;
    // return NULL, because there is no functional equivalence in this case
    return NULL;
}